

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O0

void anon_unknown.dwarf_254993::wavEncodeDecode
               (Array2D<unsigned_short> *a,Array2D<unsigned_short> *b,int nx,int ny)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  int in_ECX;
  int in_EDX;
  Array2D<unsigned_short> *in_RSI;
  Array2D<unsigned_short> *in_RDI;
  int x;
  int y;
  unsigned_short mx;
  int local_24;
  int local_20;
  
  uVar1 = maxValue(in_RSI,in_EDX,in_ECX);
  puVar2 = Imf_3_4::Array2D<unsigned_short>::operator[](in_RDI,0);
  Imf_3_4::wav2Encode(puVar2,in_EDX,1,in_ECX,in_EDX,uVar1);
  puVar2 = Imf_3_4::Array2D<unsigned_short>::operator[](in_RDI,0);
  Imf_3_4::wav2Decode(puVar2,in_EDX,1,in_ECX,in_EDX,uVar1);
  local_20 = 0;
  do {
    if (in_ECX <= local_20) {
      return;
    }
    for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
      puVar2 = Imf_3_4::Array2D<unsigned_short>::operator[](in_RDI,(long)local_20);
      uVar1 = puVar2[local_24];
      puVar2 = Imf_3_4::Array2D<unsigned_short>::operator[](in_RSI,(long)local_20);
      if (uVar1 != puVar2[local_24]) {
        __assert_fail("a[y][x] == b[y][x]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testWav.cpp"
                      ,0x9b,
                      "void (anonymous namespace)::wavEncodeDecode(Array2D<unsigned short> &, const Array2D<unsigned short> &, int, int)"
                     );
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void
wavEncodeDecode (
    Array2D<unsigned short>&       a,
    const Array2D<unsigned short>& b,
    int                            nx,
    int                            ny)
{
    unsigned short mx = maxValue (a, nx, ny);

    //cout << "encoding " << flush;

    wav2Encode (&a[0][0], nx, 1, ny, nx, mx);

    //cout << "decoding " << flush;

    wav2Decode (&a[0][0], nx, 1, ny, nx, mx);

    //cout << "comparing" << endl;

    for (int y = 0; y < ny; ++y)
    {
        for (int x = 0; x < nx; ++x)
        {
            //cout << x << ' ' << y << ' ' << a[y][x] << ' ' << b[y][x] << endl;
            assert (a[y][x] == b[y][x]);
        }
    }
}